

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<float>::DecomposeEquations
          (TPZFrontNonSym<float> *this,int64_t mineq,int64_t maxeq,TPZEqnArray<float> *eqnarray)

{
  TPZEqnArray<float>::Reset(eqnarray);
  TPZEqnArray<float>::SetNonSymmetric(eqnarray);
  for (; mineq <= maxeq; mineq = mineq + 1) {
    DecomposeOneEquation(this,mineq,eqnarray);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::DecomposeEquations(int64_t mineq, int64_t maxeq, TPZEqnArray<TVar> & eqnarray){
	// message #1.1 to eqnarray:TPZEqnArray
	int64_t ieq;
	
	eqnarray.Reset();
	eqnarray.SetNonSymmetric();
	
	for (ieq = mineq; ieq <= maxeq; ieq++) {
		// message #1.2.1 to this:TPZFront
		this->DecomposeOneEquation(ieq, eqnarray);
		//			this->Print("Teste.txt",output);
	}
}